

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

double ** EDCircles::AllocateMatrix(int noRows,int noColumns)

{
  double **ppdVar1;
  double *__s;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (long)noRows * 8;
  if (noRows < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppdVar1 = (double **)operator_new__(uVar2);
  if (0 < noRows) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < noColumns) {
      uVar2 = (long)noColumns * 8;
    }
    uVar3 = 0;
    do {
      __s = (double *)operator_new__(uVar2);
      ppdVar1[uVar3] = __s;
      memset(__s,0,(long)noColumns * 8);
      uVar3 = uVar3 + 1;
    } while ((uint)noRows != uVar3);
  }
  return ppdVar1;
}

Assistant:

double ** EDCircles::AllocateMatrix(int noRows, int noColumns)
{
	double **m = new double *[noRows];
	
	for (int i = 0; i<noRows; i++) {
		m[i] = new double[noColumns];
		memset(m[i], 0, sizeof(double)*noColumns);
	} // end-for

	return m;
}